

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::RepeatedField<unsigned_int>::erase
          (RepeatedField<unsigned_int> *this,const_iterator first,const_iterator last)

{
  void *__dest;
  int iVar1;
  LogMessage *other;
  void *pvVar2;
  size_t __n;
  long lVar3;
  int iVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  pvVar2 = this->arena_or_elements_;
  if (first == last) {
    lVar3 = (long)(int)((ulong)((long)first - (long)pvVar2) >> 2);
  }
  else {
    iVar1 = this->current_size_;
    lVar3 = (long)(int)((ulong)((long)first - (long)pvVar2) >> 2);
    __dest = (void *)((long)pvVar2 + lVar3 * 4);
    __n = (long)pvVar2 + ((long)iVar1 * 4 - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
      pvVar2 = this->arena_or_elements_;
      iVar1 = this->current_size_;
    }
    iVar4 = (int)((long)__dest + (__n - (long)pvVar2) >> 2);
    if (iVar1 < iVar4) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x3bd);
      other = internal::LogMessage::operator<<
                        (&local_58,"CHECK failed: (new_size) <= (current_size_): ");
      internal::LogFinisher::operator=(&local_59,other);
      internal::LogMessage::~LogMessage(&local_58);
      iVar1 = this->current_size_;
    }
    if (0 < iVar1) {
      this->current_size_ = iVar4;
    }
  }
  return (iterator)(lVar3 * 4 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}